

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdSummary.cpp
# Opt level: O2

string * renderHolidays(string *__return_storage_ptr__,
                       map<Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<Datetime>,_std::allocator<std::pair<const_Datetime,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *holidays)

{
  string *psVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  allocator<char> local_201;
  string *local_200;
  string local_1f8;
  string local_1d8;
  stringstream out;
  ostream local_1a8 [376];
  
  local_200 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&out);
  for (p_Var3 = (holidays->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left; psVar1 = local_200
      , (_Rb_tree_header *)p_Var3 != &(holidays->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"Y-M-D",&local_201);
    Datetime::toString(&local_1d8,(Datetime *)(p_Var3 + 1),&local_1f8);
    poVar2 = std::operator<<(local_1a8,(string *)&local_1d8);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,(string *)&p_Var3[2]._M_left);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1f8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  return psVar1;
}

Assistant:

std::string renderHolidays (const std::map <Datetime, std::string>& holidays)
{
  std::stringstream out;

  for (auto& entry : holidays)
  {
    out << entry.first.toString ("Y-M-D")
        << " "
        << entry.second
        << '\n';
  }

  return out.str ();
}